

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimeGenerator.cpp
# Opt level: O1

int __thiscall primesieve::PrimeGenerator::init(PrimeGenerator *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  int extraout_EAX;
  ulong uVar2;
  size_t __n;
  long *in_RDX;
  ulong uVar3;
  
  uVar3 = (this->super_Erat).start_;
  if (uVar3 < 0x2d0) {
    if (uVar3 < 2) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)(byte)(anonymous_namespace)::smallPrimes[uVar3 + 0x3ff];
    }
    uVar1 = (this->super_Erat).stop_;
    uVar2 = 0x80;
    if (uVar1 < 0x2cf) {
      uVar2 = (ulong)(byte)(anonymous_namespace)::primePi[uVar1];
    }
    *in_RDX = uVar2 - uVar3;
    uVar3 = (ulong)(uint)((int)uVar3 << 3);
    __n = (uint)((int)uVar2 << 3) - uVar3;
    if (__n != 0) {
      memcpy(*(void **)ctx,(anonymous_namespace)::smallPrimes + uVar3,__n);
    }
  }
  initErat(this);
  return extraout_EAX;
}

Assistant:

void PrimeGenerator::init(vector<uint64_t>& primes, size_t* size)
{
  if (start_ <= maxCachedPrime())
  {
    size_t a = getStartIdx();
    size_t b = getStopIdx();

    *size = b - a;
    assert(*size <= primes.size());

    copy(smallPrimes.begin() + a,
         smallPrimes.begin() + b,
         primes.begin());
  }

  initErat();
}